

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

void __thiscall
icu_63::Locale::setKeywordValue
          (Locale *this,StringPiece keywordName,StringPiece keywordValue,UErrorCode *status)

{
  StringPiece s;
  CharString keywordValue_nul;
  CharString keywordName_nul;
  CharString local_a0;
  CharString local_60;
  
  CharString::CharString(&local_60,keywordName,status);
  s._8_8_ = keywordValue._8_8_ & 0xffffffff;
  s.ptr_ = keywordValue.ptr_;
  CharString::CharString(&local_a0,s,status);
  setKeywordValue(this,local_60.buffer.ptr,local_a0.buffer.ptr,status);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_a0.buffer);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_60.buffer);
  return;
}

Assistant:

void
Locale::setKeywordValue(StringPiece keywordName,
                        StringPiece keywordValue,
                        UErrorCode& status) {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    const CharString keywordValue_nul(keywordValue, status);
    setKeywordValue(keywordName_nul.data(), keywordValue_nul.data(), status);
}